

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_suite.cpp
# Opt level: O0

void test_one_object(void)

{
  view_type vVar1;
  undefined4 local_188;
  value local_184 [5];
  size_t local_170;
  view_type skipped;
  undefined1 local_150 [8];
  reader reader;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&skipped._M_str,
             "{\"skip\": \"me\"}");
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_150,(view_type *)&skipped._M_str);
  vVar1 = trial::protocol::json::partial::skip<char>((basic_reader<char> *)local_150);
  skipped._M_len = (size_t)vVar1._M_str;
  local_170 = vVar1._M_len;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[15]>
            ("skipped","R\"({\"skip\": \"me\"})\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x1d,"void test_one_object()",&local_170,"{\"skip\": \"me\"}");
  local_184[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_188 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x1e,"void test_one_object()",local_184,&local_188);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_150);
  return;
}

Assistant:

void test_one_object()
{
    json::reader reader(R"({"skip": "me"})");
    auto skipped = json::partial::skip(reader);
    TRIAL_PROTOCOL_TEST_EQUAL(skipped, R"({"skip": "me"})");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}